

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# database.cpp
# Opt level: O2

unique_ptr<groundupdb::IQueryResult,_std::default_delete<groundupdb::IQueryResult>_> __thiscall
groundupdbext::EmbeddedDatabase::Impl::query(Impl *this,BucketQuery *query)

{
  _func_int **pp_Var1;
  _Head_base<0UL,_std::unordered_set<groundupdb::EncodedValue,_std::hash<groundupdb::EncodedValue>,_std::equal_to<groundupdb::EncodedValue>,_std::allocator<groundupdb::EncodedValue>_>_*,_false>
  _Var2;
  long *in_RDX;
  string idxKey;
  unique_ptr<std::unordered_set<groundupdb::EncodedValue,_std::hash<groundupdb::EncodedValue>,_std::equal_to<groundupdb::EncodedValue>,_std::allocator<groundupdb::EncodedValue>_>,_std::default_delete<std::unordered_set<groundupdb::EncodedValue,_std::hash<groundupdb::EncodedValue>,_std::equal_to<groundupdb::EncodedValue>,_std::allocator<groundupdb::EncodedValue>_>_>_>
  local_a0;
  _Head_base<0UL,_std::unordered_set<groundupdb::EncodedValue,_std::hash<groundupdb::EncodedValue>,_std::equal_to<groundupdb::EncodedValue>,_std::allocator<groundupdb::EncodedValue>_>_*,_false>
  local_98;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  HashedValue local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  
  (**(code **)(*in_RDX + 0x10))(&local_70);
  std::operator+(&local_38,"bucket::",
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_70);
  std::__cxx11::string::~string((string *)&local_70);
  pp_Var1 = query[5].super_Query._vptr_Query;
  std::__cxx11::string::string((string *)&local_90,(string *)&local_38);
  groundupdb::HashedValue::HashedValue<std::__cxx11::string>(&local_70,&local_90);
  (**(code **)(*pp_Var1 + 0x28))(&local_a0,pp_Var1,&local_70);
  std::
  make_unique<groundupdbext::DefaultQueryResult,std::unique_ptr<std::unordered_set<groundupdb::EncodedValue,std::hash<groundupdb::EncodedValue>,std::equal_to<groundupdb::EncodedValue>,std::allocator<groundupdb::EncodedValue>>,std::default_delete<std::unordered_set<groundupdb::EncodedValue,std::hash<groundupdb::EncodedValue>,std::equal_to<groundupdb::EncodedValue>,std::allocator<groundupdb::EncodedValue>>>>>
            ((unique_ptr<std::unordered_set<groundupdb::EncodedValue,_std::hash<groundupdb::EncodedValue>,_std::equal_to<groundupdb::EncodedValue>,_std::allocator<groundupdb::EncodedValue>_>,_std::default_delete<std::unordered_set<groundupdb::EncodedValue,_std::hash<groundupdb::EncodedValue>,_std::equal_to<groundupdb::EncodedValue>,_std::allocator<groundupdb::EncodedValue>_>_>_>
              *)&local_98);
  _Var2._M_head_impl = local_98._M_head_impl;
  local_98._M_head_impl =
       (unordered_set<groundupdb::EncodedValue,_std::hash<groundupdb::EncodedValue>,_std::equal_to<groundupdb::EncodedValue>,_std::allocator<groundupdb::EncodedValue>_>
        *)0x0;
  std::
  unique_ptr<std::unordered_set<groundupdb::EncodedValue,_std::hash<groundupdb::EncodedValue>,_std::equal_to<groundupdb::EncodedValue>,_std::allocator<groundupdb::EncodedValue>_>,_std::default_delete<std::unordered_set<groundupdb::EncodedValue,_std::hash<groundupdb::EncodedValue>,_std::equal_to<groundupdb::EncodedValue>,_std::allocator<groundupdb::EncodedValue>_>_>_>
  ::~unique_ptr(&local_a0);
  groundupdb::HashedValue::~HashedValue(&local_70);
  std::__cxx11::string::~string((string *)&local_90);
  (this->super_IDatabase)._vptr_IDatabase = (_func_int **)_Var2._M_head_impl;
  std::__cxx11::string::~string((string *)&local_38);
  return (__uniq_ptr_data<groundupdb::IQueryResult,_std::default_delete<groundupdb::IQueryResult>,_true,_true>
          )(__uniq_ptr_data<groundupdb::IQueryResult,_std::default_delete<groundupdb::IQueryResult>,_true,_true>
            )this;
}

Assistant:

std::unique_ptr<IQueryResult>
EmbeddedDatabase::Impl::query(BucketQuery& query) const {
  // Bucket query
  // construct a name for our key index
  std::string idxKey("bucket::" + query.bucket());
  // query the key index

  //std::cout << "EDB::Impl:query fetching kv set for bucket with key: " << idxKey << std::endl;
  std::unique_ptr<IQueryResult> r = std::make_unique<DefaultQueryResult>(m_indexStore->getKeyValueSet(HashedKey(idxKey)));
  //std::cout << "EDB::Impl:query result size: " << r.get()->recordKeys()->size() << std::endl;
  return std::move(r);
}